

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourcesGL::LoadUniforms(ShaderResourcesGL *this,LoadUniformsAttribs *Attribs)

{
  ushort *puVar1;
  GLuint GVar2;
  Uint32 UVar3;
  pointer pSVar4;
  LoadUniformsAttribs *pLVar5;
  pointer pUVar6;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  RangeStart;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  RangeEnd;
  pointer pSVar7;
  bool bVar8;
  int iVar9;
  GLenum GVar10;
  GLuint GVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  char *pcVar15;
  ulong uVar16;
  ShaderCodeVariableDescX *pSVar17;
  size_t sVar18;
  IMemoryAllocator *RawAllocator;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  *Images_00;
  pointer pSVar19;
  GLuint GVar20;
  long lVar21;
  iterator __begin5;
  char *pcVar22;
  ShaderCodeVariableDescX *this_00;
  GLProgramObj *GLProgram;
  char *pcVar23;
  __normal_iterator<Diligent::ShaderCodeVariableDescX_*,_std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>
  __i;
  pointer pcVar24;
  pointer pSVar25;
  ShaderCodeVariableDescX *this_01;
  uint uVar26;
  pointer pvVar27;
  Uint32 i;
  Uint32 UVar28;
  size_t sVar29;
  vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
  *this_02;
  pointer pUVar30;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar31;
  bool IsMS;
  RESOURCE_DIMENSION ResDim;
  GLenum dataType;
  GLenum err;
  uint uStack_2b4;
  char *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a8;
  ShaderCodeVariableDesc *pSStack_298;
  LoadUniformsAttribs *local_290;
  pointer local_288;
  GLint size;
  ShaderCodeVariableDescX *local_278;
  vector<char,_std::allocator<char>_> Name;
  string msg;
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  local_1f0;
  PIPELINE_RESOURCE_FLAGS ResourceFlags;
  undefined7 uStack_1d7;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  GLenum err_4;
  Uint32 UStack_1b4;
  ShaderCodeVariableDesc *pSStack_1b0;
  vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  local_1a8;
  GLint NameLen;
  GLint numActiveShaderStorageBlocks;
  GLint activeUniformBlockMaxLength;
  SHADER_RESOURCE_TYPE ResourceType;
  undefined7 uStack_177;
  Char local_168 [16];
  vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  UniformVars;
  GLint numActiveUniformBlocks;
  GLint activeUniformMaxLength;
  GLint numActiveUniforms;
  GLenum err_7;
  vector<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  UniformBlocks;
  GLenum err_9;
  undefined4 uStack_e4;
  __normal_iterator<const_Diligent::ShaderCodeBufferDescX_*,_std::vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>_>
  _Stack_e0;
  pointer local_d8;
  vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  StorageBlocks;
  vector<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  Images;
  vector<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  Textures;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  NamesPool;
  
  if ((Attribs->SamplerResourceFlag & ~PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) !=
      PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[100]>
              (&msg,(char (*) [100])
                    "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1c8);
    std::__cxx11::string::~string((string *)&msg);
  }
  UniformBlocks.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  UniformBlocks.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  UniformBlocks.
  super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Textures.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Textures.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Textures.
  super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Images.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Images.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Images.
  super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StorageBlocks.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  StorageBlocks.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  StorageBlocks.
  super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NamesPool._M_h._M_buckets = &NamesPool._M_h._M_single_bucket;
  NamesPool._M_h._M_bucket_count = 1;
  NamesPool._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  NamesPool._M_h._M_element_count = 0;
  NamesPool._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  NamesPool._M_h._M_rehash_policy._M_next_resize = 0;
  NamesPool._M_h._M_single_bucket = (__node_base_ptr)0x0;
  UniformVars.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformVars.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  UniformVars.
  super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  GLProgram = Attribs->GLProgram;
  if (GLProgram->m_uiHandle == 0) {
    FormatString<char[16]>(&msg,(char (*) [16])"Null GL program");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1d6);
    std::__cxx11::string::~string((string *)&msg);
    GLProgram = Attribs->GLProgram;
  }
  GLContextState::SetProgram(Attribs->State,GLProgram);
  GVar2 = Attribs->GLProgram->m_uiHandle;
  this->m_ShaderStages = Attribs->ShaderStages;
  numActiveUniforms = 0;
  local_290 = Attribs;
  (*__glewGetProgramiv)(GVar2,0x8b86,&numActiveUniforms);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[45],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de,(char (*) [45])"Unable to get the number of active uniforms\n",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1de);
    std::__cxx11::string::~string((string *)&msg);
  }
  activeUniformMaxLength = 0;
  (*__glewGetProgramiv)(GVar2,0x8b87,&activeUniformMaxLength);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[47],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3,(char (*) [47])"Unable to get the maximum uniform name length\n",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e3);
    std::__cxx11::string::~string((string *)&msg);
  }
  numActiveUniformBlocks = 0;
  (*__glewGetProgramiv)(GVar2,0x8a36,&numActiveUniformBlocks);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[51],char[17],unsigned_int>
              (false,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7,(char (*) [51])"Unable to get the number of active uniform blocks\n",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"LoadUniforms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x1e7);
    std::__cxx11::string::~string((string *)&msg);
  }
  activeUniformBlockMaxLength = 0;
  (*__glewGetProgramiv)(GVar2,0x8a35,&activeUniformBlockMaxLength);
  iVar9 = glGetError();
  if (iVar9 != 0) {
    FormatString<char[53]>
              (&msg,(char (*) [53])"Unable to get the maximum uniform block name length.");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  if (activeUniformBlockMaxLength < 1) {
    activeUniformBlockMaxLength = 0x400;
  }
  uVar13 = activeUniformBlockMaxLength;
  if (activeUniformBlockMaxLength < activeUniformMaxLength) {
    uVar13 = activeUniformMaxLength;
  }
  numActiveShaderStorageBlocks = 0;
  if (__glewGetProgramInterfaceiv != (PFNGLGETPROGRAMINTERFACEIVPROC)0x0) {
    (*__glewGetProgramInterfaceiv)(GVar2,0x92e6,0x92f5,&numActiveShaderStorageBlocks);
    GVar10 = glGetError();
    if (GVar10 != 0) {
      err = GVar10;
      LogError<false,char[51],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201,(char (*) [51])"Unable to get the number of shader storage blocks\n",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x201);
      std::__cxx11::string::~string((string *)&msg);
    }
    _err = (pointer)((ulong)uStack_2b4 << 0x20);
    (*__glewGetProgramInterfaceiv)(GVar2,0x92e6,0x92f6,(GLint *)&err);
    iVar9 = glGetError();
    _err_4 = CONCAT44(UStack_1b4,iVar9);
    if (iVar9 != 0) {
      LogError<false,char[60],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206,(char (*) [60])
                        "Unable to get the maximum shader storage block name length\n",
                 (char (*) [17])"\nGL Error Code: ",&err_4);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x206);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((int)uVar13 <= (int)err) {
      uVar13 = err;
    }
  }
  local_278 = (ShaderCodeVariableDescX *)0x200;
  if (0x200 < uVar13) {
    local_278 = (ShaderCodeVariableDescX *)(ulong)uVar13;
  }
  std::vector<char,_std::allocator<char>_>::vector
            (&Name,(ulong)((int)local_278 + 1),(allocator_type *)&msg);
  for (GVar20 = 0; (int)GVar20 < numActiveUniforms; GVar20 = GVar20 + 1) {
    dataType = 0;
    size = 0;
    NameLen = 0;
    (*__glewGetActiveUniform)
              (GVar2,GVar20,(GLsizei)local_278,&NameLen,&size,&dataType,
               Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start);
    iVar9 = glGetError();
    err = iVar9;
    if (iVar9 != 0) {
      LogError<false,char[30],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x218,(char (*) [30])"Unable to get active uniform\n",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x218);
      std::__cxx11::string::~string((string *)&msg);
    }
    sVar29 = (size_t)NameLen;
    if (((int)local_278 <= NameLen) ||
       (sVar14 = strlen(Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start), sVar14 != sVar29)) {
      FormatString<char[23]>(&msg,(char (*) [23])"Incorrect uniform name");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x219);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (size < 1) {
      FormatString<char[34]>(&msg,(char (*) [34])"Size is expected to be at least 1");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x21a);
      std::__cxx11::string::~string((string *)&msg);
    }
    GLTextureTypeToResourceDim(dataType,&ResDim,&IsMS);
    if (dataType - 0x904c < 0x21) {
      if ((dataType - 0x9051 < 0x17) && ((0x400801U >> (dataType - 0x9051 & 0x1f) & 1) != 0)) {
        ResourceType = 5;
        ResourceFlags = 4;
      }
      else {
        ResourceType = 4;
        ResourceFlags = 0;
      }
      RemoveArrayBrackets(Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      _err = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
      pVar31 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&NamesPool,&err);
      msg._M_dataplus._M_p =
           *(pointer *)
            ((long)pVar31.first.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            + 8);
      _err_4 = CONCAT44(UStack_1b4,size);
      std::
      vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                ((vector<Diligent::ShaderResourcesGL::ImageInfo,std::allocator<Diligent::ShaderResourcesGL::ImageInfo>>
                  *)&Images,(char **)&msg,&local_290->ShaderStages,&ResourceType,&ResourceFlags,
                 &err_4,&dataType,&ResDim,&IsMS);
    }
    else if (((((dataType - 0x8dc0 < 0x19) && ((0x1dfde3fU >> (dataType - 0x8dc0 & 0x1f) & 1) != 0))
              || (dataType - 0x8b5d < 6)) || ((dataType - 0x9108 < 6 || (dataType - 0x900c < 4))))
            || (dataType == 0x8d66)) {
      if ((dataType - 0x8dc2 < 0x17) && ((0x404001U >> (dataType - 0x8dc2 & 0x1f) & 1) != 0)) {
        ResourceType = 3;
        ResourceFlags = PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER;
      }
      else {
        ResourceType = 2;
        ResourceFlags = local_290->SamplerResourceFlag;
      }
      RemoveArrayBrackets(Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
      _err = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
      pVar31 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&NamesPool,&err);
      msg._M_dataplus._M_p =
           *(pointer *)
            ((long)pVar31.first.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            + 8);
      _err_4 = CONCAT44(UStack_1b4,size);
      std::
      vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&,unsigned_int,unsigned_int&,Diligent::RESOURCE_DIMENSION&,bool&>
                ((vector<Diligent::ShaderResourcesGL::TextureInfo,std::allocator<Diligent::ShaderResourcesGL::TextureInfo>>
                  *)&Textures,(char **)&msg,&local_290->ShaderStages,&ResourceType,&ResourceFlags,
                 &err_4,&dataType,&ResDim,&IsMS);
    }
    else if (local_290->LoadUniformBufferReflection == true) {
      GLDataTypeToShaderCodeVariableDesc(dataType);
      if (msg.field_2._M_local_buf[1] != '\0') {
        msg._M_dataplus._M_p =
             Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
        local_288 = (pointer)CONCAT44(local_288._4_4_,local_290->SourceLang);
        _err_4 = CONCAT44(UStack_1b4,GVar20);
        _ResourceType = 0xffffffff;
        (*__glewGetActiveUniformsiv)(GVar2,1,&err_4,0x8a3a,(GLint *)&ResourceType);
        iVar9 = glGetError();
        _ResourceFlags = iVar9;
        if (iVar9 != 0) {
          LogError<false,char[51],unsigned_int,char[17],unsigned_int>
                    (false,"AddUniformBufferVariable",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0xde,(char (*) [51])"Failed to get the uniform block index for uniform ",
                     &err_4,(char (*) [17])"\nGL Error Code: ",(uint *)&ResourceFlags);
          FormatString<char[6]>((string *)&err,(char (*) [6])0x2b552e);
          DebugAssertionFailed
                    (_err,"AddUniformBufferVariable",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0xde);
          std::__cxx11::string::~string((string *)&err);
        }
        if (-1 < (int)_ResourceType) {
          if ((ulong)(((long)UniformVars.
                             super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)UniformVars.
                            super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18) <=
              ((ulong)_ResourceType & 0xffffffff)) {
            std::
            vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
            ::resize(&UniformVars,((ulong)_ResourceType & 0xffffffff) + 1);
          }
          this_02 = (vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                     *)(UniformVars.
                        super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)_ResourceType);
          std::
          vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
          ::emplace_back<Diligent::ShaderCodeVariableDesc_const&>
                    (this_02,(ShaderCodeVariableDesc *)&msg);
          lVar21 = *(long *)(this_02 + 8);
          if ((int)local_288 == 1) {
            if (*(char *)(lVar21 + -0x70) == '\x02') {
              puVar1 = (ushort *)(lVar21 + -0x6e);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
            ShaderCodeVariableDescX::SetDefaultTypeName
                      ((ShaderCodeVariableDescX *)(lVar21 + -0x80),SHADER_SOURCE_LANGUAGE_HLSL);
          }
          if ((byte)(*(char *)(lVar21 + -0x70) - 3U) < 2) {
            _ResourceFlags = 0xffffffff;
            (*__glewGetActiveUniformsiv)(GVar2,1,&err_4,0x8a3e,(GLint *)&ResourceFlags);
            err_7 = glGetError();
            if (err_7 != 0) {
              LogError<false,char[65],char[17],unsigned_int>
                        (false,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0xfc,(char (*) [65])
                               "Failed to get the value of the GL_UNIFORM_IS_ROW_MAJOR parameter",
                         (char (*) [17])"\nGL Error Code: ",&err_7);
              FormatString<char[6]>((string *)&err,(char (*) [6])0x2b552e);
              DebugAssertionFailed
                        (_err,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0xfc);
              std::__cxx11::string::~string((string *)&err);
            }
            if (-1 < (int)_ResourceFlags) {
              *(char *)(lVar21 + -0x70) = (_ResourceFlags == 0) + '\x03';
            }
          }
          _ResourceFlags = 0xffffffff;
          (*__glewGetActiveUniformsiv)(GVar2,1,&err_4,0x8a3c,(GLint *)&ResourceFlags);
          err_7 = glGetError();
          if (err_7 != 0) {
            LogError<false,char[65],char[17],unsigned_int>
                      (false,"AddUniformBufferVariable",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x10a,(char (*) [65])
                              "Failed to get the value of the GL_UNIFORM_ARRAY_STRIDE parameter",
                       (char (*) [17])"\nGL Error Code: ",&err_7);
            FormatString<char[6]>((string *)&err,(char (*) [6])0x2b552e);
            DebugAssertionFailed
                      (_err,"AddUniformBufferVariable",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x10a);
            std::__cxx11::string::~string((string *)&err);
          }
          if (0 < (int)_ResourceFlags) {
            err_7 = 0xffffffff;
            (*__glewGetActiveUniformsiv)(GVar2,1,&err_4,0x8a38,(GLint *)&err_7);
            iVar9 = glGetError();
            _err_9 = (ShaderCodeBufferDescX *)CONCAT44(uStack_e4,iVar9);
            if (iVar9 != 0) {
              LogError<false,char[57],char[17],unsigned_int>
                        (false,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x110,(char (*) [57])
                                "Failed to get the value of the GL_UNIFORM_SIZE parameter",
                         (char (*) [17])"\nGL Error Code: ",&err_9);
              FormatString<char[6]>((string *)&err,(char (*) [6])0x2b552e);
              DebugAssertionFailed
                        (_err,"AddUniformBufferVariable",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x110);
              std::__cxx11::string::~string((string *)&err);
            }
            if (0 < (int)err_7) {
              *(GLenum *)(lVar21 + -0x68) = err_7;
            }
          }
          _ResourceFlags = 0xffffffff;
          (*__glewGetActiveUniformsiv)(GVar2,1,&err_4,0x8a3b,(GLint *)&ResourceFlags);
          err_7 = glGetError();
          if (err_7 != 0) {
            LogError<false,char[59],char[17],unsigned_int>
                      (false,"AddUniformBufferVariable",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x11a,(char (*) [59])
                              "Failed to get the value of the GL_UNIFORM_OFFSET parameter",
                       (char (*) [17])"\nGL Error Code: ",&err_7);
            FormatString<char[6]>((string *)&err,(char (*) [6])0x2b552e);
            DebugAssertionFailed
                      (_err,"AddUniformBufferVariable",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x11a);
            std::__cxx11::string::~string((string *)&err);
          }
          if (-1 < (int)_ResourceFlags) {
            *(Uint32 *)(lVar21 + -0x6c) = _ResourceFlags;
          }
        }
      }
    }
  }
  GVar20 = 0;
  while ((int)GVar20 < numActiveUniformBlocks) {
    _err_4 = _err_4 & 0xffffffff00000000;
    pcVar23 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    (*__glewGetActiveUniformBlockName)
              (GVar2,GVar20,(GLsizei)local_278,(GLsizei *)&err_4,
               Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start);
    iVar9 = glGetError();
    err = iVar9;
    if (iVar9 != 0) {
      pcVar23 = "Unable to get active uniform block name\n";
      LogError<false,char[41],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2c8,(char (*) [41])"Unable to get active uniform block name\n",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2c8);
      std::__cxx11::string::~string((string *)&msg);
    }
    pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    sVar29 = (size_t)(int)err_4;
    if (((int)local_278 <= (int)err_4) ||
       (sVar14 = strlen(Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start), sVar14 != sVar29)) {
      FormatString<char[29]>(&msg,(char (*) [29])"Incorrect uniform block name");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2c9);
      std::__cxx11::string::~string((string *)&msg);
      pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start;
    }
    GVar11 = (*__glewGetUniformBlockIndex)(GVar2,pcVar24);
    _ResourceType = GVar11;
    iVar9 = glGetError();
    err = iVar9;
    if (iVar9 != 0) {
      pcVar23 = "Unable to get active uniform block index\n";
      LogError<false,char[42],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2d0,(char (*) [42])"Unable to get active uniform block index\n",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x2d0);
      std::__cxx11::string::~string((string *)&msg);
    }
    pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    local_288 = (pointer)CONCAT44(local_288._4_4_,GVar20);
    pcVar15 = strchr(Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,0x5b);
    UVar28 = 1;
    if (pcVar15 == (char *)0x0) {
LAB_001987c2:
      _err = pcVar24;
      pVar31 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&NamesPool,&err);
      msg._M_dataplus._M_p =
           *(pointer *)
            ((long)pVar31.first.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            + 8);
      err_7 = CONCAT31(err_7._1_3_,1);
      _ResourceFlags = UVar28;
      std::
      vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                ((vector<Diligent::ShaderResourcesGL::UniformBufferInfo,std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>>
                  *)&UniformBlocks,(char **)&msg,&local_290->ShaderStages,
                 (SHADER_RESOURCE_TYPE *)&err_7,(uint *)&ResourceFlags,(uint *)&ResourceType);
      iVar9 = (int)local_288;
    }
    else {
      iVar12 = atoi(pcVar15 + 1);
      pUVar6 = UniformBlocks.
               super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar22 = (char *)UniformBlocks.
                        super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      iVar9 = 0;
      if (0 < iVar12) {
        iVar9 = iVar12;
      }
      UVar28 = iVar9 + 1;
      *pcVar15 = '\0';
      pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start;
      if (UniformBlocks.
          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          UniformBlocks.
          super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001987c2;
      iVar9 = strcmp(UniformBlocks.
                     super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].super_GLResourceAttribs.Name,
                     Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      if (iVar9 != 0) {
        for (; pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start, (pointer)pcVar22 != pUVar6;
            pcVar22 = pcVar22 + 0x18) {
          iVar9 = strcmp(*(char **)pcVar22,
                         Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
          if (iVar9 == 0) {
            FormatString<char[30],char_const*,char[30]>
                      (&msg,(Diligent *)"Uniform block with the name \'",(char (*) [30])pcVar22,
                       (char **)"\' has already been enumerated",(char (*) [30])pcVar23);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x2ed);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
        goto LAB_001987c2;
      }
      UVar3 = pUVar6[-1].super_GLResourceAttribs.ArraySize;
      if ((int)UVar3 < (int)UVar28) {
        UVar3 = UVar28;
      }
      iVar9 = (int)local_288;
      if (_ResourceType != iVar12 + *(int *)&pUVar6[-1].super_GLResourceAttribs.field_0x14) {
        FormatString<char[52]>
                  (&msg,(char (*) [52])"Uniform block indices are expected to be continuous");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x2e5);
        std::__cxx11::string::~string((string *)&msg);
      }
      pUVar6[-1].super_GLResourceAttribs.ArraySize = UVar3;
    }
    GVar20 = iVar9 + 1;
  }
  GVar20 = 0;
  do {
    pLVar5 = local_290;
    if (numActiveShaderStorageBlocks <= (int)GVar20) {
      msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffff00000000;
      msg._M_string_length = msg._M_string_length & 0xffffffff00000000;
      GLContextState::SetProgram(local_290->State,(GLProgramObj *)&msg);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::
      ~GLObjWrapper((GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper> *)&msg);
      Images_00 = &Images;
      pcVar23 = (char *)&StorageBlocks;
      AllocateResources(this,&UniformBlocks,&Textures,Images_00,
                        (vector<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                         *)pcVar23);
      if (UniformVars.
          super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          UniformVars.
          super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (pLVar5->LoadUniformBufferReflection == false) {
          FormatString<char[26],char[36]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"Attribs.LoadUniformBufferReflection",(char (*) [36])Images_00);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"LoadUniforms",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                     ,0x33a);
          std::__cxx11::string::~string((string *)&msg);
        }
        pUVar6 = UniformBlocks.
                 super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _err_9 = (ShaderCodeBufferDescX *)0x0;
        _Stack_e0._M_current = (ShaderCodeBufferDescX *)0x0;
        local_d8 = (pointer)0x0;
        for (pUVar30 = UniformBlocks.
                       super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            RangeEnd._M_current = _Stack_e0._M_current, RangeStart._M_current = _err_9,
            pvVar27 = UniformVars.
                      super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, pUVar30 != pUVar6;
            pUVar30 = pUVar30 + 1) {
          uVar13 = *(uint *)&(pUVar30->super_GLResourceAttribs).field_0x14;
          if ((ulong)uVar13 <
              (ulong)(((long)UniformVars.
                             super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)UniformVars.
                            super__Vector_base<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
            dataType = 0;
            (*__glewGetActiveUniformBlockiv)(GVar2,uVar13,0x8a40,(GLint *)&dataType);
            iVar9 = glGetError();
            err = iVar9;
            if (iVar9 != 0) {
              pcVar23 = "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter";
              LogError<false,char[68],char[17],unsigned_int>
                        (false,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x345,(char (*) [68])
                                "Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter"
                         ,(char (*) [17])"\nGL Error Code: ",&err);
              FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"LoadUniforms",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                         ,0x345);
              std::__cxx11::string::~string((string *)&msg);
            }
            pvVar27 = pvVar27 + uVar13;
            local_290 = (LoadUniformsAttribs *)CONCAT44(local_290._4_4_,dataType);
            pSVar19 = (pvVar27->
                      super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar4 = (pvVar27->
                     super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_288 = pUVar30;
            if (pSVar19 != pSVar4) {
              uVar16 = (long)pSVar4 - (long)pSVar19 >> 7;
              lVar21 = 0x3f;
              if (uVar16 != 0) {
                for (; uVar16 >> lVar21 == 0; lVar21 = lVar21 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                        (pSVar19,pSVar4,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
              if ((long)pSVar4 - (long)pSVar19 < 0x801) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                          (pSVar19,pSVar4);
              }
              else {
                pSVar25 = pSVar19 + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                          (pSVar19,pSVar25);
                for (; pSVar25 != pSVar4; pSVar25 = pSVar25 + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeVariableDescX*,std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>>,__gnu_cxx::__ops::_Val_comp_iter<Diligent::PrepareUBReflection(std::vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>&&,unsigned_int)::__0>>
                            (pSVar25);
                }
              }
            }
            msg.field_2._M_allocated_capacity = 0;
            msg.field_2._8_8_ = 0;
            msg._M_dataplus._M_p = (pointer)0x0;
            msg._M_string_length = 0;
            pSVar19 = (pointer)0x0;
            local_1f0.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1f0.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1f0.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_278 = (pvVar27->
                        super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            for (this_00 = (pvVar27->
                           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                           )._M_impl.super__Vector_impl_data._M_start; this_00 != local_278;
                this_00 = this_00 + 1) {
              pcVar15 = (this_00->super_ShaderCodeVariableDesc).Name;
              pcVar22 = strchr(pcVar15,0x2e);
              this_01 = (ShaderCodeVariableDescX *)&msg;
              while (pcVar22 != (char *)0x0) {
                _ResourceType = local_168;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&ResourceType,pcVar15,pcVar22);
                _ResourceFlags = (pointer)&local_1c8;
                local_1d0 = 0;
                local_1c8._M_local_buf[0] = '\0';
                iVar9 = Parsing::GetArrayIndex((string *)&ResourceType,(string *)&ResourceFlags);
                pSVar17 = ShaderCodeVariableDescX::FindMember(this_01,_ResourceFlags);
                if (pSVar17 == (ShaderCodeVariableDescX *)0x0) {
                  aStack_2a8._8_8_ = 0;
                  pSStack_298 = (ShaderCodeVariableDesc *)0x0;
                  local_2b0 = (char *)0x0;
                  _err = _ResourceFlags;
                  aStack_2a8._M_allocated_capacity._4_4_ =
                       (this_00->super_ShaderCodeVariableDesc).Offset;
                  aStack_2a8._M_allocated_capacity._0_4_ = 5;
                  sVar18 = ShaderCodeVariableDescX::AddMember
                                     (this_01,(ShaderCodeVariableDesc *)&err);
                  pSVar19 = (this_01->Members).
                            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pSVar17 = pSVar19 + sVar18;
                  uVar13 = pSVar19[sVar18].super_ShaderCodeVariableDesc.ArraySize;
                  uVar26 = iVar9 + 1U;
                  if (iVar9 + 1U < uVar13) {
                    uVar26 = uVar13;
                  }
                  pSVar19[sVar18].super_ShaderCodeVariableDesc.ArraySize = uVar26;
                }
                else {
                  uVar13 = (pSVar17->super_ShaderCodeVariableDesc).ArraySize;
                  uVar26 = iVar9 + 1U;
                  if (iVar9 + 1U < uVar13) {
                    uVar26 = uVar13;
                  }
                  (pSVar17->super_ShaderCodeVariableDesc).ArraySize = uVar26;
                  if ((this_00->super_ShaderCodeVariableDesc).Offset <
                      (pSVar17->super_ShaderCodeVariableDesc).Offset) {
                    FormatString<char[26],char[27]>
                              ((string *)&err,(Diligent *)"Debug expression failed:\n",
                               (char (*) [26])"Var.Offset >= pVar->Offset",(char (*) [27])pSVar19);
                    pSVar19 = (pointer)0x170;
                    DebugAssertionFailed
                              (_err,"PrepareUBReflection",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                               ,0x170);
                    std::__cxx11::string::~string((string *)&err);
                  }
                }
                pcVar15 = pcVar22 + 1;
                pcVar22 = strchr(pcVar15,0x2e);
                std::__cxx11::string::~string((string *)&ResourceFlags);
                std::__cxx11::string::~string((string *)&ResourceType);
                this_01 = pSVar17;
              }
              _err = (pointer)&aStack_2a8;
              local_2b0 = (char *)0x0;
              aStack_2a8._M_allocated_capacity =
                   aStack_2a8._M_allocated_capacity & 0xffffffffffffff00;
              std::__cxx11::string::string
                        ((string *)&ResourceType,pcVar15,(allocator *)&ResourceFlags);
              iVar9 = Parsing::GetArrayIndex((string *)&ResourceType,(string *)&err);
              std::__cxx11::string::~string((string *)&ResourceType);
              pSVar17 = ShaderCodeVariableDescX::FindMember(this_01,_err);
              if (pSVar17 == (ShaderCodeVariableDescX *)0x0) {
                bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&err,(this_00->super_ShaderCodeVariableDesc).Name);
                if (bVar8) {
                  std::__cxx11::string::string((string *)&err_7,(string *)&err);
                  ShaderCodeVariableDescX::SetName(this_00,(string *)&err_7);
                  std::__cxx11::string::~string((string *)&err_7);
                }
                uVar13 = (this_00->super_ShaderCodeVariableDesc).ArraySize;
                uVar26 = iVar9 + 1U;
                if (iVar9 + 1U < uVar13) {
                  uVar26 = uVar13;
                }
                (this_00->super_ShaderCodeVariableDesc).ArraySize = uVar26;
                ShaderCodeVariableDescX::AddMember(this_01,this_00);
              }
              else {
                uVar13 = (pSVar17->super_ShaderCodeVariableDesc).ArraySize;
                uVar26 = iVar9 + 1U;
                if (iVar9 + 1U < uVar13) {
                  uVar26 = uVar13;
                }
                (pSVar17->super_ShaderCodeVariableDesc).ArraySize = uVar26;
                uVar13 = (this_00->super_ShaderCodeVariableDesc).Offset;
                pSVar19 = (pointer)(ulong)uVar13;
                if (uVar13 < (pSVar17->super_ShaderCodeVariableDesc).Offset) {
                  FormatString<char[26],char[29]>
                            ((string *)&ResourceType,(Diligent *)"Debug expression failed:\n",
                             (char (*) [26])"Var.Offset >= pArray->Offset",(char (*) [29])pSVar19);
                  pSVar19 = (pointer)0x19e;
                  DebugAssertionFailed
                            (_ResourceType,"PrepareUBReflection",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                             ,0x19e);
                  std::__cxx11::string::~string((string *)&ResourceType);
                }
              }
              std::__cxx11::string::~string((string *)&err);
            }
            pSStack_1b0 = (ShaderCodeVariableDesc *)0x0;
            local_1a8.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1a8.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1a8.
            super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            _err_4 = (ulong)local_290 & 0xffffffff;
            ShaderCodeBufferDescX::AssignVariables((ShaderCodeBufferDescX *)&err_4,&local_1f0);
            _err = (pointer)((long)local_1f0.
                                   super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1f0.
                                   super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7);
            uVar13 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&err);
            msg.field_2._12_4_ = uVar13;
            lVar21 = 0;
            for (uVar16 = 0; uVar16 < _err_4 >> 0x20; uVar16 = uVar16 + 1) {
              ProcessUBVariable((ShaderCodeVariableDescX *)
                                ((long)&((local_1a8.
                                          super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_ShaderCodeVariableDesc).Name + lVar21),0);
              lVar21 = lVar21 + 0x80;
            }
            ShaderCodeVariableDescX::~ShaderCodeVariableDescX((ShaderCodeVariableDescX *)&msg);
            std::
            vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
            ::emplace_back<Diligent::ShaderCodeBufferDescX>
                      ((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                        *)&err_9,(ShaderCodeBufferDescX *)&err_4);
            std::
            vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
            ::~vector(&local_1a8);
            pUVar30 = local_288;
          }
          else {
            FormatString<char[15],unsigned_int,char[19]>
                      (&msg,(Diligent *)"Uniform block ",
                       (char (*) [15])&(pUVar30->super_GLResourceAttribs).field_0x14,
                       (uint *)" has no variables.",(char (*) [19])pcVar23);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x34b);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
        RawAllocator = GetRawAllocator();
        ShaderCodeBufferDescX::
        PackArray<__gnu_cxx::__normal_iterator<Diligent::ShaderCodeBufferDescX_const*,std::vector<Diligent::ShaderCodeBufferDescX,std::allocator<Diligent::ShaderCodeBufferDescX>>>>
                  ((ShaderCodeBufferDescX *)&msg,RangeStart,RangeEnd,RawAllocator);
        std::__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::
        operator=((__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                  &this->m_UBReflectionBuffer,
                  (__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                  &msg);
        std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
                  ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)&msg
                  );
        std::
        vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>::
        ~vector((vector<Diligent::ShaderCodeBufferDescX,_std::allocator<Diligent::ShaderCodeBufferDescX>_>
                 *)&err_9);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&Name.super__Vector_base<char,_std::allocator<char>_>);
      std::
      vector<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>,_std::allocator<std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>_>
      ::~vector(&UniformVars);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&NamesPool._M_h);
      std::
      _Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
      ::~_Vector_base(&StorageBlocks.
                       super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                     );
      std::
      _Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
      ::~_Vector_base(&Images.
                       super__Vector_base<Diligent::ShaderResourcesGL::ImageInfo,_std::allocator<Diligent::ShaderResourcesGL::ImageInfo>_>
                     );
      std::
      _Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
      ::~_Vector_base(&Textures.
                       super__Vector_base<Diligent::ShaderResourcesGL::TextureInfo,_std::allocator<Diligent::ShaderResourcesGL::TextureInfo>_>
                     );
      std::
      _Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
      ::~_Vector_base(&UniformBlocks.
                       super__Vector_base<Diligent::ShaderResourcesGL::UniformBufferInfo,_std::allocator<Diligent::ShaderResourcesGL::UniformBufferInfo>_>
                     );
      return;
    }
    _err_4 = _err_4 & 0xffffffff00000000;
    pcVar23 = (char *)&err_4;
    (*__glewGetProgramResourceName)
              (GVar2,0x92e6,GVar20,(GLsizei)local_278,(GLsizei *)pcVar23,
               Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start);
    iVar9 = glGetError();
    err = iVar9;
    if (iVar9 != 0) {
      pcVar23 = "Unable to get shader storage block name\n";
      LogError<false,char[41],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x304,(char (*) [41])"Unable to get shader storage block name\n",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x304);
      std::__cxx11::string::~string((string *)&msg);
    }
    pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    sVar29 = (size_t)(int)err_4;
    if (((int)local_278 <= (int)err_4) ||
       (sVar14 = strlen(Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start), sVar14 != sVar29)) {
      FormatString<char[36]>(&msg,(char (*) [36])"Incorrect shader storage block name");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x305);
      std::__cxx11::string::~string((string *)&msg);
      pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start;
    }
    GVar11 = (*__glewGetProgramResourceIndex)(GVar2,0x92e6,pcVar24);
    _ResourceType = GVar11;
    iVar9 = glGetError();
    err = iVar9;
    if (iVar9 != 0) {
      pcVar23 = "Unable to get shader storage block index\n";
      LogError<false,char[42],char[17],unsigned_int>
                (false,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x308,(char (*) [42])"Unable to get shader storage block index\n",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"LoadUniforms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                 ,0x308);
      std::__cxx11::string::~string((string *)&msg);
    }
    pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    local_288 = (pointer)CONCAT44(local_288._4_4_,GVar20);
    pcVar15 = strchr(Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,0x5b);
    UVar28 = 1;
    if (pcVar15 == (char *)0x0) {
LAB_00198b30:
      _err = pcVar24;
      pVar31 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char*>((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)&NamesPool,&err);
      msg._M_dataplus._M_p =
           *(pointer *)
            ((long)pVar31.first.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            + 8);
      err_7 = CONCAT31(err_7._1_3_,5);
      _ResourceFlags = UVar28;
      std::
      vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
      ::
      emplace_back<char_const*,Diligent::SHADER_TYPE_const&,Diligent::SHADER_RESOURCE_TYPE,unsigned_int,unsigned_int&>
                ((vector<Diligent::ShaderResourcesGL::StorageBlockInfo,std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>>
                  *)&StorageBlocks,(char **)&msg,&local_290->ShaderStages,
                 (SHADER_RESOURCE_TYPE *)&err_7,(uint *)&ResourceFlags,(uint *)&ResourceType);
      iVar9 = (int)local_288;
    }
    else {
      iVar12 = atoi(pcVar15 + 1);
      pSVar7 = StorageBlocks.
               super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar22 = (char *)StorageBlocks.
                        super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      iVar9 = 0;
      if (0 < iVar12) {
        iVar9 = iVar12;
      }
      UVar28 = iVar9 + 1;
      *pcVar15 = '\0';
      pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start;
      if (StorageBlocks.
          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          StorageBlocks.
          super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00198b30;
      iVar9 = strcmp(StorageBlocks.
                     super__Vector_base<Diligent::ShaderResourcesGL::StorageBlockInfo,_std::allocator<Diligent::ShaderResourcesGL::StorageBlockInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].super_GLResourceAttribs.Name,
                     Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      if (iVar9 != 0) {
        for (; pcVar24 = Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start, (pointer)pcVar22 != pSVar7;
            pcVar22 = pcVar22 + 0x18) {
          iVar9 = strcmp(*(char **)pcVar22,
                         Name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
          if (iVar9 == 0) {
            FormatString<char[30],char_const*,char[30]>
                      (&msg,(Diligent *)"Storage block with the name \"",(char (*) [30])pcVar22,
                       (char **)"\" has already been enumerated",(char (*) [30])pcVar23);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"LoadUniforms",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                       ,0x321);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
        goto LAB_00198b30;
      }
      UVar3 = pSVar7[-1].super_GLResourceAttribs.ArraySize;
      if ((int)UVar3 < (int)UVar28) {
        UVar3 = UVar28;
      }
      iVar9 = (int)local_288;
      if (_ResourceType != iVar12 + *(int *)&pSVar7[-1].super_GLResourceAttribs.field_0x14) {
        FormatString<char[52]>
                  (&msg,(char (*) [52])"Storage block indices are expected to be continuous");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"LoadUniforms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
                   ,0x319);
        std::__cxx11::string::~string((string *)&msg);
      }
      pSVar7[-1].super_GLResourceAttribs.ArraySize = UVar3;
    }
    GVar20 = iVar9 + 1;
  } while( true );
}

Assistant:

void ShaderResourcesGL::LoadUniforms(const LoadUniformsAttribs& Attribs)
{
    VERIFY(Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_NONE || Attribs.SamplerResourceFlag == PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER,
           "Only NONE (for GLSL source) and COMBINED_SAMPLER (for HLSL source) are valid sampler resource flags");

    // Load uniforms to temporary arrays. We will then pack all variables into a single chunk of memory.
    std::vector<UniformBufferInfo> UniformBlocks;
    std::vector<TextureInfo>       Textures;
    std::vector<ImageInfo>         Images;
    std::vector<StorageBlockInfo>  StorageBlocks;
    std::unordered_set<String>     NamesPool;

    // Linear list of unrolled uniform variables grouped by the uniform block index, e.g.:
    //   0: f4, u4, s1.f4[0]
    //   1: s2.s1.f4[0], s3.s2[0].s1.f4[1]
    std::vector<std::vector<ShaderCodeVariableDescX>> UniformVars;

    VERIFY(Attribs.GLProgram, "Null GL program");
    Attribs.State.SetProgram(Attribs.GLProgram);

    GLuint GLProgram = Attribs.GLProgram;
    m_ShaderStages   = Attribs.ShaderStages;

    GLint numActiveUniforms = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORMS, &numActiveUniforms);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniforms\n");

    // Query the maximum name length of the active uniform (including null terminator)
    GLint activeUniformMaxLength = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_MAX_LENGTH, &activeUniformMaxLength);
    DEV_CHECK_GL_ERROR("Unable to get the maximum uniform name length\n");

    GLint numActiveUniformBlocks = 0;
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCKS, &numActiveUniformBlocks);
    DEV_CHECK_GL_ERROR("Unable to get the number of active uniform blocks\n");

    //
    // #### This parameter is currently unsupported by Intel OGL drivers.
    //
    // Query the maximum name length of the active uniform block (including null terminator)
    GLint activeUniformBlockMaxLength = 0;
    // On Intel driver, this call might fail:
    glGetProgramiv(GLProgram, GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, &activeUniformBlockMaxLength);
#ifdef DILIGENT_DEVELOPMENT
    if (glGetError() != GL_NO_ERROR)
    {
        LOG_WARNING_MESSAGE("Unable to get the maximum uniform block name length.");
    }
#endif

    if (activeUniformBlockMaxLength <= 0)
        activeUniformBlockMaxLength = 1024;

    auto MaxNameLength = std::max(activeUniformMaxLength, activeUniformBlockMaxLength);

#if GL_ARB_program_interface_query
    GLint numActiveShaderStorageBlocks = 0;
    if (glGetProgramInterfaceiv)
    {
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_ACTIVE_RESOURCES, &numActiveShaderStorageBlocks);
        DEV_CHECK_GL_ERROR("Unable to get the number of shader storage blocks\n");

        // Query the maximum name length of the active shader storage block (including null terminator)
        GLint MaxShaderStorageBlockNameLen = 0;
        glGetProgramInterfaceiv(GLProgram, GL_SHADER_STORAGE_BLOCK, GL_MAX_NAME_LENGTH, &MaxShaderStorageBlockNameLen);
        DEV_CHECK_GL_ERROR("Unable to get the maximum shader storage block name length\n");
        MaxNameLength = std::max(MaxNameLength, MaxShaderStorageBlockNameLen);
    }
#endif

    MaxNameLength = std::max(MaxNameLength, 512);
    std::vector<GLchar> Name(static_cast<size_t>(MaxNameLength) + 1);
    for (int i = 0; i < numActiveUniforms; i++)
    {
        GLenum dataType = 0;
        GLint  size     = 0;
        GLint  NameLen  = 0;
        // If one or more elements of an array are active, the name of the array is returned in 'name',
        // the type is returned in 'type', and the 'size' parameter returns the highest array element index used,
        // plus one, as determined by the compiler and/or linker.
        // Only one active uniform variable will be reported for a uniform array.
        // Uniform variables other than arrays will have a size of 1
        glGetActiveUniform(GLProgram, i, MaxNameLength, &NameLen, &size, &dataType, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform name");
        VERIFY(size >= 1, "Size is expected to be at least 1");
        // Note that
        // glGetActiveUniform( program, index, bufSize, length, size, type, name );
        //
        // is equivalent to
        //
        // const enum props[] = { ARRAY_SIZE, TYPE };
        // glGetProgramResourceName( program, UNIFORM, index, bufSize, length, name );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[0], 1, NULL, size );
        // glGetProgramResourceiv( program, GL_UNIFORM, index, 1, &props[1], 1, NULL, (int *)type );
        //
        // The latter is only available in GL 4.4 and GLES 3.1

        RESOURCE_DIMENSION ResDim;
        bool               IsMS;
        GLTextureTypeToResourceDim(dataType, ResDim, IsMS);

        switch (dataType)
        {
            case GL_SAMPLER_1D:
            case GL_SAMPLER_2D:
            case GL_SAMPLER_3D:
            case GL_SAMPLER_CUBE:
            case GL_SAMPLER_1D_SHADOW:
            case GL_SAMPLER_2D_SHADOW:

            case GL_SAMPLER_1D_ARRAY:
            case GL_SAMPLER_2D_ARRAY:
            case GL_SAMPLER_1D_ARRAY_SHADOW:
            case GL_SAMPLER_2D_ARRAY_SHADOW:
            case GL_SAMPLER_CUBE_SHADOW:

            case GL_SAMPLER_EXTERNAL_OES:

            case GL_INT_SAMPLER_1D:
            case GL_INT_SAMPLER_2D:
            case GL_INT_SAMPLER_3D:
            case GL_INT_SAMPLER_CUBE:
            case GL_INT_SAMPLER_1D_ARRAY:
            case GL_INT_SAMPLER_2D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_1D:
            case GL_UNSIGNED_INT_SAMPLER_2D:
            case GL_UNSIGNED_INT_SAMPLER_3D:
            case GL_UNSIGNED_INT_SAMPLER_CUBE:
            case GL_UNSIGNED_INT_SAMPLER_1D_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_ARRAY:

            case GL_SAMPLER_CUBE_MAP_ARRAY:
            case GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW:
            case GL_INT_SAMPLER_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY:

            case GL_SAMPLER_2D_MULTISAMPLE:
            case GL_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE:
            case GL_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:

            case GL_SAMPLER_BUFFER:
            case GL_INT_SAMPLER_BUFFER:
            case GL_UNSIGNED_INT_SAMPLER_BUFFER:
            {
                const auto IsBuffer =
                    dataType == GL_SAMPLER_BUFFER ||
                    dataType == GL_INT_SAMPLER_BUFFER ||
                    dataType == GL_UNSIGNED_INT_SAMPLER_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_SRV :
                    SHADER_RESOURCE_TYPE_TEXTURE_SRV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    Attribs.SamplerResourceFlag // PIPELINE_RESOURCE_FLAG_NONE for HLSL source or
                                                // PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER for GLSL source
                    ;

                RemoveArrayBrackets(Name.data());

                Textures.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }

#if GL_ARB_shader_image_load_store
            case GL_IMAGE_1D:
            case GL_IMAGE_2D:
            case GL_IMAGE_3D:
            case GL_IMAGE_2D_RECT:
            case GL_IMAGE_CUBE:
            case GL_IMAGE_BUFFER:
            case GL_IMAGE_1D_ARRAY:
            case GL_IMAGE_2D_ARRAY:
            case GL_IMAGE_CUBE_MAP_ARRAY:
            case GL_IMAGE_2D_MULTISAMPLE:
            case GL_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_INT_IMAGE_1D:
            case GL_INT_IMAGE_2D:
            case GL_INT_IMAGE_3D:
            case GL_INT_IMAGE_2D_RECT:
            case GL_INT_IMAGE_CUBE:
            case GL_INT_IMAGE_BUFFER:
            case GL_INT_IMAGE_1D_ARRAY:
            case GL_INT_IMAGE_2D_ARRAY:
            case GL_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_INT_IMAGE_2D_MULTISAMPLE:
            case GL_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_1D:
            case GL_UNSIGNED_INT_IMAGE_2D:
            case GL_UNSIGNED_INT_IMAGE_3D:
            case GL_UNSIGNED_INT_IMAGE_2D_RECT:
            case GL_UNSIGNED_INT_IMAGE_CUBE:
            case GL_UNSIGNED_INT_IMAGE_BUFFER:
            case GL_UNSIGNED_INT_IMAGE_1D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_CUBE_MAP_ARRAY:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE:
            case GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE_ARRAY:
            {
                const auto IsBuffer =
                    dataType == GL_IMAGE_BUFFER ||
                    dataType == GL_INT_IMAGE_BUFFER ||
                    dataType == GL_UNSIGNED_INT_IMAGE_BUFFER;
                const auto ResourceType = IsBuffer ?
                    SHADER_RESOURCE_TYPE_BUFFER_UAV :
                    SHADER_RESOURCE_TYPE_TEXTURE_UAV;
                const auto ResourceFlags = IsBuffer ?
                    PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER :
                    PIPELINE_RESOURCE_FLAG_NONE;

                RemoveArrayBrackets(Name.data());

                Images.emplace_back(
                    NamesPool.emplace(Name.data()).first->c_str(),
                    Attribs.ShaderStages,
                    ResourceType,
                    ResourceFlags,
                    static_cast<Uint32>(size),
                    dataType,
                    ResDim,
                    IsMS //
                );
                break;
            }
#endif

            default:
                // Some other uniform type like scalar, matrix etc.
                if (Attribs.LoadUniformBufferReflection)
                {
                    auto VarDesc = GLDataTypeToShaderCodeVariableDesc(dataType);
                    if (VarDesc.BasicType != SHADER_CODE_BASIC_TYPE_UNKNOWN)
                    {
                        // All uniforms are reported as unrolled variables, e.g. s2.s1[1].f4[0]
                        VarDesc.Name = Name.data();
                        AddUniformBufferVariable(GLProgram, i, VarDesc, UniformVars, Attribs.SourceLang);
                    }
                }
                break;
        }
    }

    for (int i = 0; i < numActiveUniformBlocks; i++)
    {
        // In contrast to shader uniforms, every element in uniform block array is enumerated individually
        GLsizei NameLen = 0;
        glGetActiveUniformBlockName(GLProgram, i, MaxNameLength, &NameLen, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block name\n");
        VERIFY(NameLen < MaxNameLength && static_cast<size_t>(NameLen) == strlen(Name.data()), "Incorrect uniform block name");

        // glGetActiveUniformBlockName( program, uniformBlockIndex, bufSize, length, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceName(program, GL_UNIFORM_BLOCK, uniformBlockIndex, bufSize, length, uniformBlockName);

        auto UniformBlockIndex = glGetUniformBlockIndex(GLProgram, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get active uniform block index\n");
        // glGetUniformBlockIndex( program, uniformBlockName );
        // is equivalent to
        // glGetProgramResourceIndex( program, GL_UNIFORM_BLOCK, uniformBlockName );

        bool IsNewBlock = true;

        GLint ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!UniformBlocks.empty())
            {
                // Look at previous uniform block to check if it is the same array
                auto& LastBlock = UniformBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(UniformBlockIndex == LastBlock.UBIndex + Ind, "Uniform block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#ifdef DILIGENT_DEBUG
                    for (const auto& ub : UniformBlocks)
                        VERIFY(strcmp(ub.Name, Name.data()) != 0, "Uniform block with the name '", ub.Name, "' has already been enumerated");
#endif
                }
            }
        }

        if (IsNewBlock)
        {
            UniformBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_CONSTANT_BUFFER,
                static_cast<Uint32>(ArraySize),
                UniformBlockIndex //
            );
        }
    }

#if GL_ARB_shader_storage_buffer_object
    for (int i = 0; i < numActiveShaderStorageBlocks; ++i)
    {
        GLsizei Length = 0;
        glGetProgramResourceName(GLProgram, GL_SHADER_STORAGE_BLOCK, i, MaxNameLength, &Length, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block name\n");
        VERIFY(Length < MaxNameLength && static_cast<size_t>(Length) == strlen(Name.data()), "Incorrect shader storage block name");

        auto SBIndex = glGetProgramResourceIndex(GLProgram, GL_SHADER_STORAGE_BLOCK, Name.data());
        DEV_CHECK_GL_ERROR("Unable to get shader storage block index\n");

        bool  IsNewBlock     = true;
        Int32 ArraySize      = 1;
        auto* OpenBracketPtr = strchr(Name.data(), '[');
        if (OpenBracketPtr != nullptr)
        {
            auto Ind        = atoi(OpenBracketPtr + 1);
            ArraySize       = std::max(ArraySize, Ind + 1);
            *OpenBracketPtr = 0;
            if (!StorageBlocks.empty())
            {
                // Look at previous storage block to check if it is the same array
                auto& LastBlock = StorageBlocks.back();
                if (strcmp(LastBlock.Name, Name.data()) == 0)
                {
                    ArraySize = std::max(ArraySize, static_cast<GLint>(LastBlock.ArraySize));
                    VERIFY(static_cast<GLint>(SBIndex) == LastBlock.SBIndex + Ind, "Storage block indices are expected to be continuous");
                    LastBlock.ArraySize = ArraySize;
                    IsNewBlock          = false;
                }
                else
                {
#    ifdef DILIGENT_DEBUG
                    for (const auto& sb : StorageBlocks)
                        VERIFY(strcmp(sb.Name, Name.data()) != 0, "Storage block with the name \"", sb.Name, "\" has already been enumerated");
#    endif
                }
            }
        }

        if (IsNewBlock)
        {
            StorageBlocks.emplace_back(
                NamesPool.emplace(Name.data()).first->c_str(),
                Attribs.ShaderStages,
                SHADER_RESOURCE_TYPE_BUFFER_UAV,
                static_cast<Uint32>(ArraySize),
                SBIndex //
            );
        }
    }
#endif

    Attribs.State.SetProgram(GLObjectWrappers::GLProgramObj::Null());

    AllocateResources(UniformBlocks, Textures, Images, StorageBlocks);

    if (!UniformVars.empty())
    {
        VERIFY_EXPR(Attribs.LoadUniformBufferReflection);

        std::vector<ShaderCodeBufferDescX> UBReflections;
        for (const auto& UB : UniformBlocks)
        {
            if (UB.UBIndex < UniformVars.size())
            {
                auto& Vars = UniformVars[UB.UBIndex];

                GLint BufferSize = 0;
                glGetActiveUniformBlockiv(GLProgram, UB.UBIndex, GL_UNIFORM_BLOCK_DATA_SIZE, &BufferSize);
                DEV_CHECK_GL_ERROR("Failed to get the value of the GL_UNIFORM_BLOCK_DATA_SIZE parameter");

                UBReflections.emplace_back(PrepareUBReflection(std::move(Vars), StaticCast<Uint32>(BufferSize)));
            }
            else
            {
                UNEXPECTED("Uniform block ", UB.UBIndex, " has no variables.");
            }
        }

        m_UBReflectionBuffer = ShaderCodeBufferDescX::PackArray(UBReflections.cbegin(), UBReflections.cend(), GetRawAllocator());
    }
}